

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O2

Cycles __thiscall
Electron::ConcreteMachine<true>::perform_bus_operation
          (ConcreteMachine<true> *this,BusOperation operation,uint16_t address,uint8_t *value)

{
  uint8_t *puVar1;
  Tape *pTVar2;
  Typer *this_00;
  Plus3 *pPVar3;
  Observer *pOVar4;
  bool bVar5;
  Interrupt interrupt;
  char cVar6;
  uint8_t uVar7;
  Range RVar8;
  uint uVar9;
  BusState BVar10;
  long lVar11;
  ssize_t sVar12;
  byte bVar13;
  _func_int **__n;
  long lVar14;
  ulong __n_00;
  undefined6 in_register_00000012;
  int iVar15;
  uint __fd;
  int iVar16;
  WrappedInt<Cycles> rhs;
  undefined1 local_40 [8];
  _Head_base<0UL,_Electron::VideoOutput_*,_false> local_38;
  
  if (-1 < (short)address) {
    if ((int)operation < 5) {
      *value = this->ram_[address];
    }
    else {
      if (((this->video_access_range_).low_address <= address) &&
         (address <= (this->video_access_range_).high_address)) {
        JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::flush(&this->video_);
      }
      this->ram_[address] = *value;
    }
    lVar11 = (this->video_).time_since_update_.super_WrappedInt<Cycles>.length_;
    lVar14 = 0x7fffffff;
    if (lVar11 < 0x7fffffff) {
      lVar14 = lVar11;
    }
    iVar16 = -0x80000000;
    if (-0x80000000 < lVar14) {
      iVar16 = (int)lVar14;
    }
    uVar9 = VideoOutput::get_cycles_until_next_ram_availability(&(this->video_).object_,iVar16 + 1);
    iVar16 = uVar9 + 1;
    goto LAB_002f4b8c;
  }
  __fd = (uint)(void *)CONCAT62(in_register_00000012,address);
  uVar9 = __fd & 0xff0f;
  iVar16 = 1;
  if (0xf < uVar9 - 0xfe00) {
    switch(uVar9) {
    case 0xfc00:
      pPVar3 = (this->plus3_)._M_t.
               super___uniq_ptr_impl<Electron::Plus3,_std::default_delete<Electron::Plus3>_>._M_t.
               super__Tuple_impl<0UL,_Electron::Plus3_*,_std::default_delete<Electron::Plus3>_>.
               super__Head_base<0UL,_Electron::Plus3_*,_false>._M_head_impl;
      if ((__fd & 0xf0) == 0xc0 && pPVar3 != (Plus3 *)0x0) {
        if ((int)operation < 5) {
          *value = '\x01';
        }
        else {
          Plus3::set_control_register(pPVar3,*value);
        }
        goto LAB_002f4b8c;
      }
      if ((__fd & 0xf0) != 0x40) goto LAB_002f4b8c;
      this->scsi_acknowledge_ = true;
      if ((int)operation < 5) {
        BVar10 = SCSI::Bus::get_state(&this->scsi_bus_);
        *value = (uint8_t)BVar10;
      }
      else {
        this->scsi_data_ = *value;
      }
      break;
    case 0xfc01:
      if (4 < (int)operation || (__fd & 0xf0) != 0x40) goto LAB_002f4b8c;
      uVar9 = SCSI::Bus::get_state(&this->scsi_bus_);
      *value = (byte)(uVar9 >> 0x10) & 1 |
               (byte)(uVar9 >> 0xb) & 2 |
               (byte)(uVar9 >> 0xc) & 0x20 | (byte)(uVar9 >> 9) & 0x40 | (byte)(uVar9 >> 4) & 0x80 |
               (this->scsi_interrupt_mask_ & this->scsi_interrupt_state_) << 4;
      if ((this->scsi_select_ != true) ||
         (uVar9 = SCSI::Bus::get_state(&this->scsi_bus_), (uVar9 >> 0xc & 1) == 0))
      goto LAB_002f4b8c;
      this->scsi_select_ = false;
      break;
    case 0xfc02:
      if ((__fd & 0xf0) != 0x40) goto LAB_002f4b8c;
      this->scsi_select_ = true;
      break;
    case 0xfc03:
      if ((__fd & 0xf0) != 0x40) goto LAB_002f4b8c;
      this->scsi_interrupt_state_ = false;
      this->scsi_interrupt_mask_ = (bool)(*value & 1);
      goto LAB_002f50f8;
    case 0xfc04:
    case 0xfc05:
    case 0xfc06:
    case 0xfc07:
      pPVar3 = (this->plus3_)._M_t.
               super___uniq_ptr_impl<Electron::Plus3,_std::default_delete<Electron::Plus3>_>._M_t.
               super__Tuple_impl<0UL,_Electron::Plus3_*,_std::default_delete<Electron::Plus3>_>.
               super__Head_base<0UL,_Electron::Plus3_*,_false>._M_head_impl;
      bVar5 = (__fd & 0xf0) != 0xc0 || pPVar3 == (Plus3 *)0x0;
      __n_00 = (ulong)bVar5;
      if (bVar5) goto LAB_002f4b8c;
      if ((address == 0xfcc4) && (this->is_holding_shift_ != false)) {
        this->is_holding_shift_ = false;
        this->key_states_[0xd] = this->key_states_[0xd] & 0xf7;
      }
      if (4 < (int)operation) {
        WD::WD1770::write(&pPVar3->super_WD1770,__fd,(void *)(ulong)*value,__n_00);
        goto LAB_002f4b8c;
      }
      sVar12 = WD::WD1770::read(&pPVar3->super_WD1770,__fd,
                                (void *)CONCAT62(in_register_00000012,address),__n_00);
      uVar7 = (uint8_t)sVar12;
      goto LAB_002f4cec;
    default:
      goto switchD_002f4ad8_caseD_fe01;
    }
    push_scsi_output(this);
    goto LAB_002f4b8c;
  }
  __n = (_func_int **)
        ((long)&switchD_002f4ad8::switchdataD_00461cfc +
        (long)(int)(&switchD_002f4ad8::switchdataD_00461cfc)[uVar9 - 0xfe00]);
  switch(uVar9) {
  case 0xfe00:
    if ((int)operation < 5) {
      bVar13 = this->interrupt_status_;
      *value = bVar13;
      this->interrupt_status_ = bVar13 & 0xfd;
      break;
    }
    this->interrupt_control_ = *value & 0xfe;
    goto LAB_002f50f8;
  case 0xfe01:
switchD_002f4ad8_caseD_fe01:
    if (address < 0xc000) {
      iVar15 = this->active_rom_;
      if ((int)operation < 5) {
        bVar13 = this->roms_[iVar15][__fd & 0x3fff];
        *value = bVar13;
        if (this->keyboard_is_active_ == true) {
          bVar13 = bVar13 & 0xf0;
          *value = bVar13;
          for (lVar11 = 0; lVar11 != 0xe; lVar11 = lVar11 + 1) {
            if ((__fd >> ((uint)lVar11 & 0x1f) & 1) == 0) {
              bVar13 = bVar13 | this->key_states_[lVar11];
              *value = bVar13;
            }
          }
        }
        if (this->basic_is_active_ == true) {
          *value = bVar13 & this->roms_[10][__fd & 0x3fff];
        }
      }
      else if (this->rom_write_masks_[iVar15] == true) {
        this->roms_[iVar15][__fd & 0x3fff] = *value;
      }
      break;
    }
    if (4 < (int)operation) break;
    if ((operation == ReadOpcode) && (this->use_fast_tape_hack_ != false)) {
      uVar9 = address - 0xf6de;
      if (((uVar9 < 0x1e) && ((0x30000003U >> (uVar9 & 0x1f) & 1) != 0)) ||
         ((address - 0xf4e5 < 2 || (address - 0xfa51 < 2)))) {
        *value = 0xea;
        break;
      }
      if (address == 0xf0a8) {
        if (((this->m6502_).super_ProcessorBase.super_ProcessorStorage.x_ == '\x0e') &&
           (this->ram_[0x247] == '\0')) {
          pTVar2 = &this->tape_;
          (this->tape_).delegate_ = (Delegate *)0x0;
          Tape::clear_interrupts(pTVar2,'\x10');
          iVar15 = -0x31;
          while( true ) {
            Storage::Tape::TapePlayer::get_tape((TapePlayer *)local_40);
            cVar6 = (**(code **)*(_func_int **)local_40)();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38);
            if (cVar6 != '\0') break;
            Storage::Tape::TapePlayer::run_for_input_pulse(&pTVar2->super_TapePlayer);
            if (iVar15 == 0) {
              this->fast_load_is_in_data_ = false;
            }
            if ((((this->tape_).interrupt_status_ & 0x10) != 0) &&
               ((this->fast_load_is_in_data_ != false ||
                (uVar7 = Tape::get_data_register(pTVar2), uVar7 == '*')))) break;
            iVar15 = iVar15 + 1;
          }
          (this->tape_).delegate_ = &this->super_Delegate;
          Tape::clear_interrupts(pTVar2,'\x10');
          this->interrupt_status_ = this->interrupt_status_ | (this->tape_).interrupt_status_;
          this->fast_load_is_in_data_ = true;
          (this->m6502_).super_ProcessorBase.super_ProcessorStorage.a_ = '\0';
          uVar7 = Tape::get_data_register(pTVar2);
          (this->m6502_).super_ProcessorBase.super_ProcessorStorage.y_ = uVar7;
          *value = '`';
          break;
        }
        uVar7 = this->os_[0x30a8];
        goto LAB_002f4cec;
      }
    }
    uVar7 = this->os_[__fd & 0x3fff];
LAB_002f4cec:
    *value = uVar7;
    break;
  default:
    if ((int)operation < 5) break;
    goto LAB_002f4ae3;
  case 0xfe04:
    pTVar2 = &this->tape_;
    if ((int)operation < 5) {
      uVar7 = Tape::get_data_register(pTVar2);
      *value = uVar7;
      uVar7 = '\x10';
    }
    else {
      Tape::set_data_register(pTVar2,*value);
      uVar7 = ' ';
    }
    Tape::clear_interrupts(pTVar2,uVar7);
    break;
  case 0xfe05:
    if ((int)operation < 5) break;
    bVar13 = *value;
    if ((bVar13 & 0xf0) == 0) {
      this->active_rom_ = (uint)bVar13;
      bVar13 = *value;
      if ((bVar13 & 8) != 0) {
        if ((bVar13 & 4) == 0) {
          this->keyboard_is_active_ = (bVar13 & 2) == 0;
          this->basic_is_active_ = SUB41((bVar13 & 2) >> 1,0);
        }
        else {
          this->keyboard_is_active_ = false;
          this->basic_is_active_ = false;
        }
      }
      break;
    }
    if ((bVar13 & 0x10) != 0) {
      this->interrupt_status_ = this->interrupt_status_ & 0xfb;
    }
    if ((bVar13 & 0x20) != 0) {
      this->interrupt_status_ = this->interrupt_status_ & 0xf7;
    }
    if ((bVar13 & 0x40) != 0) {
      this->interrupt_status_ = this->interrupt_status_ & 0xbf;
    }
LAB_002f50f8:
    evaluate_interrupts(this);
    break;
  case 0xfe06:
    if (4 < (int)operation) {
      update_audio(this);
      SoundGenerator::set_divider(&this->sound_generator_,*value);
      Tape::set_counter(&this->tape_,*value);
    }
    break;
  case 0xfe07:
    if ((int)operation < 5) break;
    bVar13 = *value & 6;
    if (this->speaker_is_enabled_ != (bVar13 == 2)) {
      update_audio(this);
      SoundGenerator::set_is_enabled(&this->sound_generator_,bVar13 == 2);
      this->speaker_is_enabled_ = bVar13 == 2;
      bVar13 = *value & 6;
    }
    (this->tape_).is_enabled_ = bVar13 != 6;
    Tape::set_is_in_input_mode(&this->tape_,(*value & 6) == 0);
    (this->tape_).is_running_ = (bool)(*value >> 6 & 1);
    bVar13 = *value;
    this->caps_led_state_ = (bool)(bVar13 >> 7);
    pOVar4 = this->activity_observer_;
    if (pOVar4 != (Observer *)0x0) {
      __n = pOVar4->_vptr_Observer;
      (*__n[4])(pOVar4,&this->caps_led,(ulong)(bVar13 >> 7));
    }
LAB_002f4ae3:
    JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::operator->
              ((JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1> *)local_40);
    VideoOutput::write(local_38._M_head_impl,__fd,(void *)(ulong)*value,(size_t)__n);
    std::
    unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Electron::VideoOutput,_JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_40);
    RVar8 = VideoOutput::get_memory_access_range(&(this->video_).object_);
    this->video_access_range_ = RVar8;
  }
LAB_002f4b8c:
  rhs.length_ = (IntType)iVar16;
  bVar5 = JustInTimeActor<Electron::VideoOutput,_Cycles,_1,_1>::operator+=
                    (&this->video_,(Cycles)rhs.length_);
  if (bVar5) {
    interrupt = VideoOutput::get_interrupts(&(this->video_).object_);
    signal_interrupt(this,interrupt);
  }
  lVar11 = (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ + rhs.length_;
  (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = lVar11;
  if (0x4000 < lVar11) {
    update_audio(this);
  }
  Tape::run_for(&this->tape_,(Cycles)rhs.length_);
  this_00 = (this->super_TypeRecipient<Electron::CharacterMapper>).typer_._M_t.
            super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
            super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
            super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  if (this_00 != (Typer *)0x0) {
    Utility::Typer::run_for(this_00,(HalfCycles)(rhs.length_ * 2));
  }
  pPVar3 = (this->plus3_)._M_t.
           super___uniq_ptr_impl<Electron::Plus3,_std::default_delete<Electron::Plus3>_>._M_t.
           super__Tuple_impl<0UL,_Electron::Plus3_*,_std::default_delete<Electron::Plus3>_>.
           super__Head_base<0UL,_Electron::Plus3_*,_false>._M_head_impl;
  if (pPVar3 != (Plus3 *)0x0) {
    WD::WD1770::run_for(&pPVar3->super_WD1770,(Cycles)(long)(iVar16 * 4));
  }
  if ((this->shift_restart_counter_ != 0) &&
     (iVar16 = this->shift_restart_counter_ - iVar16, this->shift_restart_counter_ = iVar16,
     iVar16 < 1)) {
    this->shift_restart_counter_ = 0;
    puVar1 = &(this->m6502_).super_ProcessorBase.super_ProcessorStorage.interrupt_requests_;
    *puVar1 = *puVar1 | 0x10;
    this->key_states_[0xd] = this->key_states_[0xd] | 8;
    this->is_holding_shift_ = true;
  }
  if (this->scsi_is_clocked_ == true) {
    SCSI::Bus::run_for(&this->scsi_bus_,(HalfCycles)(rhs.length_ * 2));
  }
  return (Cycles)(WrappedInt<Cycles>)rhs.length_;
}

Assistant:

forceinline Cycles perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			unsigned int cycles = 1;

			if(address < 0x8000) {
				if(isReadOperation(operation)) {
					*value = ram_[address];
				} else {
					if(address >= video_access_range_.low_address && address <= video_access_range_.high_address) {
						video_.flush();
					}
					ram_[address] = *value;
				}

				// For the entire frame, RAM is accessible only on odd cycles; in modes below 4
				// it's also accessible only outside of the pixel regions.
				cycles += video_.last_valid()->get_cycles_until_next_ram_availability(video_.time_since_flush().template as<int>() + 1);
			} else {
				switch(address & 0xff0f) {
					case 0xfe00:
						if(isReadOperation(operation)) {
							*value = interrupt_status_;
							interrupt_status_ &= ~PowerOnReset;
						} else {
							interrupt_control_ = (*value) & ~1;
							evaluate_interrupts();
						}
					break;
					case 0xfe07:
						if(!isReadOperation(operation)) {
							// update speaker mode
							bool new_speaker_is_enabled = (*value & 6) == 2;
							if(new_speaker_is_enabled != speaker_is_enabled_) {
								update_audio();
								sound_generator_.set_is_enabled(new_speaker_is_enabled);
								speaker_is_enabled_ = new_speaker_is_enabled;
							}

							tape_.set_is_enabled((*value & 6) != 6);
							tape_.set_is_in_input_mode((*value & 6) == 0);
							tape_.set_is_running((*value & 0x40) ? true : false);

							caps_led_state_ = !!(*value & 0x80);
							if(activity_observer_)
								activity_observer_->set_led_status(caps_led, caps_led_state_);
						}

						[[fallthrough]];	// fe07 contains the display mode.


					case 0xfe02: case 0xfe03:
					case 0xfe08: case 0xfe09: case 0xfe0a: case 0xfe0b:
					case 0xfe0c: case 0xfe0d: case 0xfe0e: case 0xfe0f:
						if(!isReadOperation(operation)) {
							video_->write(address, *value);
							video_access_range_ = video_.last_valid()->get_memory_access_range();
						}
					break;
					case 0xfe04:
						if(isReadOperation(operation)) {
							*value = tape_.get_data_register();
							tape_.clear_interrupts(Interrupt::ReceiveDataFull);
						} else {
							tape_.set_data_register(*value);
							tape_.clear_interrupts(Interrupt::TransmitDataEmpty);
						}
					break;
					case 0xfe05:
						if(!isReadOperation(operation)) {
							const uint8_t interruptDisable = (*value)&0xf0;
							if( interruptDisable ) {
								if( interruptDisable&0x10 ) interrupt_status_ &= ~Interrupt::DisplayEnd;
								if( interruptDisable&0x20 ) interrupt_status_ &= ~Interrupt::RealTimeClock;
								if( interruptDisable&0x40 ) interrupt_status_ &= ~Interrupt::HighToneDetect;
								evaluate_interrupts();

								// TODO: NMI
							} else {
								// Latch the paged ROM in case external hardware is being emulated.
								active_rom_ = *value & 0xf;

								// apply the ULA's test
								if(*value & 0x08) {
									if(*value & 0x04) {
										keyboard_is_active_ = false;
										basic_is_active_ = false;
									} else {
										keyboard_is_active_ = !(*value & 0x02);
										basic_is_active_ = !keyboard_is_active_;
									}
								}
							}
						}
					break;
					case 0xfe06:
						if(!isReadOperation(operation)) {
							update_audio();
							sound_generator_.set_divider(*value);
							tape_.set_counter(*value);
						}
					break;

					case 0xfc04: case 0xfc05: case 0xfc06: case 0xfc07:
						if(plus3_ && (address&0x00f0) == 0x00c0) {
							if(is_holding_shift_ && address == 0xfcc4) {
								is_holding_shift_ = false;
								set_key_state(KeyShift, false);
							}
							if(isReadOperation(operation))
								*value = plus3_->read(address);
							else
								plus3_->write(address, *value);
						}
					break;
					case 0xfc00:
						if(plus3_ && (address&0x00f0) == 0x00c0) {
							if(!isReadOperation(operation)) {
								plus3_->set_control_register(*value);
							} else *value = 1;
						}

						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_acknowledge_ = true;
							if(!isReadOperation(operation)) {
								scsi_data_ = *value;
								push_scsi_output();
							} else {
								*value = SCSI::data_lines(scsi_bus_.get_state());
								push_scsi_output();
							}
						}
					break;
					case 0xfc03:
						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_interrupt_state_ = false;
							scsi_interrupt_mask_ = *value & 1;
							evaluate_interrupts();
						}
					break;
					case 0xfc01:
						if(has_scsi_bus && (address&0x00f0) == 0x0040 && isReadOperation(operation)) {
							// Status byte is:
							//
							//	b7:	SCSI C/D
							//	b6: SCSI I/O
							//	b5: SCSI REQ
							//	b4: interrupt flag
							//	b3:	0
							//	b2:	0
							//	b1:	SCSI BSY
							//	b0: SCSI MSG
							const auto state = scsi_bus_.get_state();
							*value =
								(state & SCSI::Line::Control ? 0x80 : 0x00) |
								(state & SCSI::Line::Input ? 0x40 : 0x00) |
								(state & SCSI::Line::Request ? 0x20 : 0x00) |
								((scsi_interrupt_state_ && scsi_interrupt_mask_) ? 0x10 : 0x00) |
								(state & SCSI::Line::Busy ? 0x02 : 0x00) |
								(state & SCSI::Line::Message ? 0x01 : 0x00);

							// Empirical guess: this is also the trigger to affect busy/request/acknowledge
							// signalling. Maybe?
							if(scsi_select_ && scsi_bus_.get_state() & SCSI::Line::Busy) {
								scsi_select_ = false;
								push_scsi_output();
							}
						}
					break;
					case 0xfc02:
						if(has_scsi_bus && (address&0x00f0) == 0x0040) {
							scsi_select_ = true;
							push_scsi_output();
						}
					break;

					// SCSI locations:
					//
					//	fc40:	data, read and write
					//	fc41:	status read
					//	fc42:	select write
					//	fc43:	interrupt latch
					//
					//
					// Interrupt latch is:
					//
					//	b0: enable or disable IRQ on REQ
					//	(and, possibly, writing to the latch acknowledges?)

					default:
						if(address >= 0xc000) {
							if(isReadOperation(operation)) {
								if(
									use_fast_tape_hack_ &&
									(operation == CPU::MOS6502::BusOperation::ReadOpcode) &&
									(
										(address == 0xf4e5) || (address == 0xf4e6) ||	// double NOPs at 0xf4e5, 0xf6de, 0xf6fa and 0xfa51
										(address == 0xf6de) || (address == 0xf6df) ||	// act to disable the normal branch into tape-handling
										(address == 0xf6fa) || (address == 0xf6fb) ||	// code, forcing the OS along the serially-accessed ROM
										(address == 0xfa51) || (address == 0xfa52) ||	// pathway.

										(address == 0xf0a8)								// 0xf0a8 is from where a service call would normally be
																						// dispatched; we can check whether it would be call 14
																						// (i.e. read byte) and, if so, whether the OS was about to
																						// issue a read byte call to a ROM despite the tape
																						// FS being selected. If so then this is a get byte that
																						// we should service synthetically. Put the byte into Y
																						// and set A to zero to report that action was taken, then
																						// allow the PC read to return an RTS.
									)
								) {
									const auto service_call = uint8_t(m6502_.value_of(CPU::MOS6502::Register::X));
									if(address == 0xf0a8) {
										if(!ram_[0x247] && service_call == 14) {
											tape_.set_delegate(nullptr);

											int cycles_left_while_plausibly_in_data = 50;
											tape_.clear_interrupts(Interrupt::ReceiveDataFull);
											while(!tape_.get_tape()->is_at_end()) {
												tape_.run_for_input_pulse();
												--cycles_left_while_plausibly_in_data;
												if(!cycles_left_while_plausibly_in_data) fast_load_is_in_data_ = false;
												if(	(tape_.get_interrupt_status() & Interrupt::ReceiveDataFull) &&
													(fast_load_is_in_data_ || tape_.get_data_register() == 0x2a)
												) break;
											}
											tape_.set_delegate(this);
											tape_.clear_interrupts(Interrupt::ReceiveDataFull);
											interrupt_status_ |= tape_.get_interrupt_status();

											fast_load_is_in_data_ = true;
											m6502_.set_value_of(CPU::MOS6502::Register::A, 0);
											m6502_.set_value_of(CPU::MOS6502::Register::Y, tape_.get_data_register());
											*value = 0x60; // 0x60 is RTS
										}
										else *value = os_[address & 16383];
									}
									else *value = 0xea;
								} else {
									*value = os_[address & 16383];
								}
							}
						} else {
							if(isReadOperation(operation)) {
								*value = roms_[active_rom_][address & 16383];
								if(keyboard_is_active_) {
									*value &= 0xf0;
									for(int address_line = 0; address_line < 14; address_line++) {
										if(!(address&(1 << address_line))) *value |= key_states_[address_line];
									}
								}
								if(basic_is_active_) {
									*value &= roms_[int(ROM::BASIC)][address & 16383];
								}
							} else if(rom_write_masks_[active_rom_]) {
								roms_[active_rom_][address & 16383] = *value;
							}
						}
					break;
				}
			}

			if(video_ += Cycles(int(cycles))) {
				signal_interrupt(video_.last_valid()->get_interrupts());
			}

			cycles_since_audio_update_ += Cycles(int(cycles));
			if(cycles_since_audio_update_ > Cycles(16384)) update_audio();
			tape_.run_for(Cycles(int(cycles)));

			if(typer_) typer_->run_for(Cycles(int(cycles)));
			if(plus3_) plus3_->run_for(Cycles(4*int(cycles)));
			if(shift_restart_counter_) {
				shift_restart_counter_ -= cycles;
				if(shift_restart_counter_ <= 0) {
					shift_restart_counter_ = 0;
					m6502_.set_power_on(true);
					set_key_state(KeyShift, true);
					is_holding_shift_ = true;
				}
			}

			if constexpr (has_scsi_bus) {
				if(scsi_is_clocked_) {
					scsi_bus_.run_for(Cycles(int(cycles)));
				}
			}

			return Cycles(int(cycles));
		}